

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O1

int pospopcnt_u16_sse_sad(uint16_t *data,uint32_t len,uint32_t *flag_counts)

{
  undefined1 (*pauVar1) [16];
  byte bVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  undefined1 auVar18 [32];
  undefined1 auVar19 [64];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar10 [16];
  
  if ((len & 0xffffffe0) == 0) {
    auVar27 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar12 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar21 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar18 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  }
  else {
    pauVar1 = (undefined1 (*) [16])(data + (len & 0xffffffe0));
    auVar10[8] = 0x41;
    auVar10._0_8_ = 0x4141414141414141;
    auVar10[9] = 0x41;
    auVar10[10] = 0x41;
    auVar10[0xb] = 0x41;
    auVar10[0xc] = 0x41;
    auVar10[0xd] = 0x41;
    auVar10[0xe] = 0x41;
    auVar10[0xf] = 0x41;
    auVar16._8_4_ = 0x3f003f;
    auVar16._0_8_ = 0x3f003f003f003f;
    auVar16._12_4_ = 0x3f003f;
    auVar23[8] = 0x82;
    auVar23._0_8_ = 0x8282828282828282;
    auVar23[9] = 0x82;
    auVar23[10] = 0x82;
    auVar23[0xb] = 0x82;
    auVar23[0xc] = 0x82;
    auVar23[0xd] = 0x82;
    auVar23[0xe] = 0x82;
    auVar23[0xf] = 0x82;
    auVar19 = ZEXT1664((undefined1  [16])0x0);
    auVar24 = ZEXT1664((undefined1  [16])0x0);
    auVar17 = ZEXT1664((undefined1  [16])0x0);
    auVar22 = ZEXT1664((undefined1  [16])0x0);
    do {
      auVar6 = vpshufb_avx(*(undefined1 (*) [16])data,_DAT_00115010);
      auVar7 = vpshufb_avx(*(undefined1 (*) [16])((long)data + 0x10),_DAT_00115010);
      auVar8 = vpshufb_avx(*(undefined1 (*) [16])((long)data + 0x20),_DAT_00115010);
      auVar9 = vpshufb_avx(*(undefined1 (*) [16])((long)data + 0x30),_DAT_00115010);
      auVar11 = vpand_avx(auVar6,auVar10);
      auVar31 = vpsadbw_avx(auVar11,(undefined1  [16])0x0);
      auVar11 = vpand_avx(auVar7,auVar10);
      auVar11 = vpsadbw_avx(auVar11,(undefined1  [16])0x0);
      auVar11 = vpaddw_avx(auVar11,auVar31);
      auVar31 = vpand_avx(auVar8,auVar10);
      auVar30 = vpsadbw_avx(auVar31,(undefined1  [16])0x0);
      auVar31 = vpand_avx(auVar9,auVar10);
      auVar31 = vpsadbw_avx(auVar31,(undefined1  [16])0x0);
      auVar31 = vpaddw_avx(auVar30,auVar31);
      auVar11 = vpaddw_avx(auVar11,auVar31);
      auVar31 = vpsrlw_avx(auVar11,6);
      auVar11 = vpand_avx(auVar11,auVar16);
      auVar11 = vpackssdw_avx(auVar31,auVar11);
      auVar11 = vpaddd_avx(auVar11,auVar19._0_16_);
      auVar19 = ZEXT1664(auVar11);
      auVar18 = ZEXT1632(auVar11);
      auVar11 = vpand_avx(auVar6,auVar23);
      auVar31 = vpsadbw_avx(auVar11,(undefined1  [16])0x0);
      auVar11 = vpand_avx(auVar7,auVar23);
      auVar11 = vpsadbw_avx(auVar11,(undefined1  [16])0x0);
      auVar11 = vpaddw_avx(auVar11,auVar31);
      auVar31 = vpand_avx(auVar8,auVar23);
      auVar30 = vpsadbw_avx(auVar31,(undefined1  [16])0x0);
      auVar31 = vpand_avx(auVar9,auVar23);
      auVar31 = vpsadbw_avx(auVar31,(undefined1  [16])0x0);
      auVar31 = vpaddw_avx(auVar30,auVar31);
      auVar11 = vpaddw_avx(auVar11,auVar31);
      auVar31 = vpavgb_avx(auVar11,(undefined1  [16])0x0);
      auVar30 = vpsrlw_avx(auVar11,7);
      auVar11 = vpand_avx(auVar31,auVar16);
      auVar11 = vpackssdw_avx(auVar30,auVar11);
      auVar11 = vpaddd_avx(auVar11,auVar24._0_16_);
      auVar24 = ZEXT1664(auVar11);
      auVar21 = ZEXT1632(auVar11);
      auVar6 = vpshldw_avx512_vbmi2(auVar6,auVar6,0xc);
      auVar7 = vpshldw_avx512_vbmi2(auVar7,auVar7,0xc);
      auVar8 = vpshldw_avx512_vbmi2(auVar8,auVar8,0xc);
      auVar9 = vpshldw_avx512_vbmi2(auVar9,auVar9,0xc);
      auVar11 = vpand_avx(auVar6,auVar10);
      auVar31 = vpsadbw_avx(auVar11,(undefined1  [16])0x0);
      auVar11 = vpand_avx(auVar7,auVar10);
      auVar11 = vpsadbw_avx(auVar11,(undefined1  [16])0x0);
      auVar11 = vpaddw_avx(auVar11,auVar31);
      auVar31 = vpand_avx(auVar8,auVar10);
      auVar30 = vpsadbw_avx(auVar31,(undefined1  [16])0x0);
      auVar31 = vpand_avx(auVar9,auVar10);
      auVar31 = vpsadbw_avx(auVar31,(undefined1  [16])0x0);
      auVar31 = vpaddw_avx(auVar30,auVar31);
      auVar11 = vpaddw_avx(auVar11,auVar31);
      auVar31 = vpsrlw_avx(auVar11,6);
      auVar11 = vpand_avx(auVar11,auVar16);
      auVar11 = vpackssdw_avx(auVar31,auVar11);
      auVar11 = vpaddd_avx(auVar11,auVar17._0_16_);
      auVar17 = ZEXT1664(auVar11);
      auVar12 = ZEXT1632(auVar11);
      auVar11 = vpand_avx(auVar6,auVar23);
      auVar31 = vpsadbw_avx(auVar11,(undefined1  [16])0x0);
      auVar11 = vpand_avx(auVar7,auVar23);
      auVar11 = vpsadbw_avx(auVar11,(undefined1  [16])0x0);
      auVar11 = vpaddw_avx(auVar11,auVar31);
      auVar31 = vpand_avx(auVar8,auVar23);
      auVar30 = vpsadbw_avx(auVar31,(undefined1  [16])0x0);
      auVar31 = vpand_avx(auVar9,auVar23);
      auVar31 = vpsadbw_avx(auVar31,(undefined1  [16])0x0);
      auVar31 = vpaddw_avx(auVar30,auVar31);
      auVar11 = vpaddw_avx(auVar11,auVar31);
      auVar31 = vpavgb_avx(auVar11,(undefined1  [16])0x0);
      auVar30 = vpsrlw_avx(auVar11,7);
      auVar11 = vpand_avx(auVar31,auVar16);
      auVar11 = vpackssdw_avx(auVar30,auVar11);
      auVar11 = vpaddd_avx(auVar11,auVar22._0_16_);
      auVar22 = ZEXT1664(auVar11);
      auVar27 = ZEXT1632(auVar11);
      data = (uint16_t *)((long)data + 0x40);
    } while ((undefined1 (*) [16])data != pauVar1);
  }
  auVar11 = auVar21._0_16_;
  auVar23 = auVar27._0_16_;
  auVar25._0_16_ = ZEXT116(0) * auVar11 + ZEXT116(1) * auVar23;
  auVar25._16_16_ = ZEXT116(0) * auVar27._16_16_ + ZEXT116(1) * auVar11;
  auVar16 = auVar18._0_16_;
  auVar10 = auVar12._0_16_;
  auVar27._0_16_ = ZEXT116(0) * auVar16 + ZEXT116(1) * auVar10;
  auVar27._16_16_ = ZEXT116(0) * auVar12._16_16_ + ZEXT116(1) * auVar16;
  auVar27 = vpunpckldq_avx2(auVar27,auVar25);
  auVar20._0_16_ = ZEXT116(0) * auVar23 + ZEXT116(1) * auVar11;
  auVar20._16_16_ = ZEXT116(0) * auVar21._16_16_ + ZEXT116(1) * auVar23;
  auVar12._0_16_ = ZEXT116(0) * auVar10 + ZEXT116(1) * auVar16;
  auVar12._16_16_ = ZEXT116(0) * auVar18._16_16_ + ZEXT116(1) * auVar10;
  auVar12 = vpunpckhdq_avx2(auVar12,auVar20);
  auVar18 = vpunpcklqdq_avx2(auVar12,auVar27);
  auVar12 = vpunpckhqdq_avx2(auVar12,auVar27);
  auVar17 = vinserti64x4_avx512f(ZEXT3264(auVar12),auVar18,1);
  auVar17 = vpaddd_avx512f(auVar17,*(undefined1 (*) [64])flag_counts);
  auVar17 = vmovdqu64_avx512f(auVar17);
  *(undefined1 (*) [64])flag_counts = auVar17;
  if ((len & 0x1f) != 0) {
    auVar17 = vpbroadcastq_avx512f();
    auVar28 = ZEXT1664((undefined1  [16])0x0);
    uVar5 = 0;
    auVar19 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar22 = vpbroadcastq_avx512f(ZEXT816(0x5555));
    auVar24 = vpbroadcastq_avx512f(ZEXT816(0x40010004001));
    auVar13 = vpbroadcastq_avx512f(ZEXT816(0x101010101010101));
    auVar29 = ZEXT1664((undefined1  [16])0x0);
    do {
      auVar14 = vmovdqa64_avx512f(auVar29);
      auVar15 = vmovdqa64_avx512f(auVar28);
      auVar28 = vpbroadcastq_avx512f();
      auVar28 = vporq_avx512f(auVar28,auVar19);
      uVar4 = vpcmpuq_avx512f(auVar28,auVar17,2);
      auVar10 = vmovdqu16_avx512vl(*(undefined1 (*) [16])(*(undefined1 (*) [16])data + uVar5 * 2));
      bVar2 = (byte)uVar4;
      auVar11._2_2_ = (ushort)((byte)(uVar4 >> 1) & 1) * auVar10._2_2_;
      auVar11._0_2_ = (ushort)(bVar2 & 1) * auVar10._0_2_;
      auVar11._4_2_ = (ushort)((byte)(uVar4 >> 2) & 1) * auVar10._4_2_;
      auVar11._6_2_ = (ushort)((byte)(uVar4 >> 3) & 1) * auVar10._6_2_;
      auVar11._8_2_ = (ushort)((byte)(uVar4 >> 4) & 1) * auVar10._8_2_;
      auVar11._10_2_ = (ushort)((byte)(uVar4 >> 5) & 1) * auVar10._10_2_;
      auVar11._12_2_ = (ushort)((byte)(uVar4 >> 6) & 1) * auVar10._12_2_;
      auVar11._14_2_ = (ushort)(byte)(uVar4 >> 7) * auVar10._14_2_;
      auVar29 = vpmovzxwq_avx512f(auVar11);
      auVar28 = vpandq_avx512f(auVar29,auVar22);
      auVar28 = vpmullq_avx512dq(auVar28,auVar24);
      auVar28 = vpandq_avx512f(auVar28,auVar13);
      auVar28 = vpaddq_avx512f(auVar28,auVar15);
      auVar29 = vpsrlq_avx512f(auVar29,1);
      auVar29 = vpandq_avx512f(auVar29,auVar22);
      auVar29 = vpmullq_avx512dq(auVar29,auVar24);
      auVar29 = vpandq_avx512f(auVar29,auVar13);
      auVar29 = vpaddq_avx512f(auVar29,auVar14);
      uVar5 = uVar5 + 8;
    } while (((len & 0x1f) + 7 & 0xfffffff8) != uVar5);
    auVar19 = vmovdqa64_avx512f(auVar29);
    auVar17._0_8_ = (ulong)(bVar2 & 1) * auVar19._0_8_ | (ulong)!(bool)(bVar2 & 1) * auVar14._0_8_;
    bVar3 = (bool)((byte)(uVar4 >> 1) & 1);
    auVar17._8_8_ = (ulong)bVar3 * auVar19._8_8_ | (ulong)!bVar3 * auVar14._8_8_;
    bVar3 = (bool)((byte)(uVar4 >> 2) & 1);
    auVar17._16_8_ = (ulong)bVar3 * auVar19._16_8_ | (ulong)!bVar3 * auVar14._16_8_;
    bVar3 = (bool)((byte)(uVar4 >> 3) & 1);
    auVar17._24_8_ = (ulong)bVar3 * auVar19._24_8_ | (ulong)!bVar3 * auVar14._24_8_;
    bVar3 = (bool)((byte)(uVar4 >> 4) & 1);
    auVar17._32_8_ = (ulong)bVar3 * auVar19._32_8_ | (ulong)!bVar3 * auVar14._32_8_;
    bVar3 = (bool)((byte)(uVar4 >> 5) & 1);
    auVar17._40_8_ = (ulong)bVar3 * auVar19._40_8_ | (ulong)!bVar3 * auVar14._40_8_;
    bVar3 = (bool)((byte)(uVar4 >> 6) & 1);
    auVar17._48_8_ = (ulong)bVar3 * auVar19._48_8_ | (ulong)!bVar3 * auVar14._48_8_;
    auVar17._56_8_ = (uVar4 >> 7) * auVar19._56_8_ | (ulong)!SUB81(uVar4 >> 7,0) * auVar14._56_8_;
    auVar19 = vmovdqa64_avx512f(auVar28);
    auVar22._0_8_ = (ulong)(bVar2 & 1) * auVar19._0_8_ | (ulong)!(bool)(bVar2 & 1) * auVar15._0_8_;
    bVar3 = (bool)((byte)(uVar4 >> 1) & 1);
    auVar22._8_8_ = (ulong)bVar3 * auVar19._8_8_ | (ulong)!bVar3 * auVar15._8_8_;
    bVar3 = (bool)((byte)(uVar4 >> 2) & 1);
    auVar22._16_8_ = (ulong)bVar3 * auVar19._16_8_ | (ulong)!bVar3 * auVar15._16_8_;
    bVar3 = (bool)((byte)(uVar4 >> 3) & 1);
    auVar22._24_8_ = (ulong)bVar3 * auVar19._24_8_ | (ulong)!bVar3 * auVar15._24_8_;
    bVar3 = (bool)((byte)(uVar4 >> 4) & 1);
    auVar22._32_8_ = (ulong)bVar3 * auVar19._32_8_ | (ulong)!bVar3 * auVar15._32_8_;
    bVar3 = (bool)((byte)(uVar4 >> 5) & 1);
    auVar22._40_8_ = (ulong)bVar3 * auVar19._40_8_ | (ulong)!bVar3 * auVar15._40_8_;
    bVar3 = (bool)((byte)(uVar4 >> 6) & 1);
    auVar22._48_8_ = (ulong)bVar3 * auVar19._48_8_ | (ulong)!bVar3 * auVar15._48_8_;
    auVar22._56_8_ = (uVar4 >> 7) * auVar19._56_8_ | (ulong)!SUB81(uVar4 >> 7,0) * auVar15._56_8_;
    auVar12 = vextracti64x4_avx512f(auVar22,1);
    auVar19 = vpaddq_avx512f(auVar22,ZEXT3264(auVar12));
    auVar10 = vpaddq_avx(auVar19._0_16_,auVar19._16_16_);
    auVar16 = vpshufd_avx(auVar10,0xee);
    auVar10 = vpaddq_avx(auVar10,auVar16);
    auVar12 = vextracti64x4_avx512f(auVar17,1);
    auVar17 = vpaddq_avx512f(auVar17,ZEXT3264(auVar12));
    auVar16 = vpaddq_avx(auVar17._0_16_,auVar17._16_16_);
    auVar23 = vpshufd_avx(auVar16,0xee);
    auVar16 = vpaddq_avx(auVar16,auVar23);
    auVar11 = vpunpckldq_avx(auVar10,auVar16);
    auVar23 = vpsrld_avx(auVar11,8);
    auVar23 = vpinsrd_avx(auVar23,auVar10._0_4_,2);
    auVar23 = vpinsrd_avx(auVar23,auVar16._0_4_,3);
    auVar23 = vpshufb_avx(auVar23,_DAT_00115020);
    auVar31 = vpunpcklqdq_avx(auVar10,auVar16);
    auVar10 = vpshufb_avx(auVar31,_DAT_00115030);
    auVar26._0_16_ = ZEXT116(0) * auVar31 + ZEXT116(1) * auVar31;
    auVar26._16_16_ = ZEXT116(1) * auVar31;
    auVar12 = vpsrlvq_avx2(auVar26,_DAT_00116540);
    auVar30 = vpmovqd_avx512vl(auVar12);
    auVar16 = vpshufb_avx(auVar11,_DAT_00115040);
    auVar21._0_16_ = ZEXT116(0) * auVar30 + ZEXT116(1) * auVar16;
    auVar21._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar30;
    auVar18._8_4_ = 0xff;
    auVar18._0_8_ = 0xff000000ff;
    auVar18._12_4_ = 0xff;
    auVar18._16_4_ = 0xff;
    auVar18._20_4_ = 0xff;
    auVar18._24_4_ = 0xff;
    auVar18._28_4_ = 0xff;
    auVar12 = vpandd_avx512vl(auVar21,auVar18);
    auVar16 = vpsrlq_avx(auVar31,0x38);
    auVar17 = vinserti32x4_avx512f(ZEXT3264(auVar12),auVar23,2);
    auVar17 = vinserti32x4_avx512f(auVar17,auVar10,3);
    auVar19 = vpmovsxbd_avx512f(_DAT_00115050);
    auVar17 = vpermi2d_avx512f(auVar19,auVar17,ZEXT1664(auVar16));
    auVar17 = vpaddd_avx512f(auVar17,*(undefined1 (*) [64])flag_counts);
    auVar17 = vmovdqu64_avx512f(auVar17);
    *(undefined1 (*) [64])flag_counts = auVar17;
  }
  return 0;
}

Assistant:

int pospopcnt_u16_sse_sad(const uint16_t* data, uint32_t len, uint32_t* flag_counts) {
    const __m128i zero = _mm_setzero_si128();
    const __m128i mask_lo_byte = _mm_srli_epi16(_mm_cmpeq_epi8(zero, zero), 8);
    const __m128i mask_lo_cnt  = _mm_srli_epi16(mask_lo_byte, 2);
    const __m128i mask_bits_a  = _mm_set1_epi8(0x41); // 01000001
    const __m128i mask_bits_b  = _mm_add_epi8(mask_bits_a, mask_bits_a);
    uint32_t buffer[16];

    __m128i counterA = zero;
    __m128i counterB = zero;
    __m128i counterC = zero;
    __m128i counterD = zero;

    for (const uint16_t* end = &data[(len & ~31)]; data != end; data += 32) {
        __m128i r0 = _mm_loadu_si128((__m128i*)&data[0]);
        __m128i r1 = _mm_loadu_si128((__m128i*)&data[8]);
        __m128i r2 = _mm_loadu_si128((__m128i*)&data[16]);
        __m128i r3 = _mm_loadu_si128((__m128i*)&data[24]);
        __m128i r4, r5, r6, r7;

        // seperate LOBYTE and HIBYTE of each WORD
        // (emulate PSHUFB F,D,B,9,7,5,3,1, E,C,A,8,6,4,2,0)
        r4 = _mm_and_si128(mask_lo_byte, r0);
        r5 = _mm_and_si128(mask_lo_byte, r1);
        r6 = _mm_and_si128(mask_lo_byte, r2);
        r7 = _mm_and_si128(mask_lo_byte, r3);
        r0 = _mm_srli_epi16(r0, 8);
        r1 = _mm_srli_epi16(r1, 8);
        r2 = _mm_srli_epi16(r2, 8);
        r3 = _mm_srli_epi16(r3, 8);
        r0 = _mm_packus_epi16(r0, r4);
        r1 = _mm_packus_epi16(r1, r5);
        r2 = _mm_packus_epi16(r2, r6);
        r3 = _mm_packus_epi16(r3, r7);

        // isolate bits to count
        r4 = _mm_and_si128(mask_bits_a, r0);
        r5 = _mm_and_si128(mask_bits_a, r1);
        r6 = _mm_and_si128(mask_bits_a, r2);
        r7 = _mm_and_si128(mask_bits_a, r3);

        // horizontal sum of qwords
        r4 = _mm_sad_epu8(r4, zero);
        r5 = _mm_sad_epu8(r5, zero);
        r6 = _mm_sad_epu8(r6, zero);
        r7 = _mm_sad_epu8(r7, zero);

        // sum 6-bit counts
        r4 = _mm_add_epi16(r4,r5);
        r4 = _mm_add_epi16(r4,r6);
        r4 = _mm_add_epi16(r4,r7);

        // unpack 6-bit counts to 32-bits
        r5 = _mm_and_si128(mask_lo_cnt, r4);
        r4 = _mm_srli_epi16(r4, 6);
        r4 = _mm_packs_epi32(r4, r5);

        // accumulate
        counterA = _mm_add_epi32(counterA, r4);

        // do it again...
        r4 = _mm_and_si128(mask_bits_b, r0);
        r5 = _mm_and_si128(mask_bits_b, r1);
        r6 = _mm_and_si128(mask_bits_b, r2);
        r7 = _mm_and_si128(mask_bits_b, r3);

        r4 = _mm_sad_epu8(r4, zero);
        r5 = _mm_sad_epu8(r5, zero);
        r6 = _mm_sad_epu8(r6, zero);
        r7 = _mm_sad_epu8(r7, zero);

        r4 = _mm_add_epi16(r4,r5);
        r4 = _mm_add_epi16(r4,r6);
        r4 = _mm_add_epi16(r4,r7);

        r5 = _mm_avg_epu8(zero, r4); // shift right 1
        r5 = _mm_and_si128(r5, mask_lo_cnt);
        r4 = _mm_srli_epi16(r4, 7);
        r4 = _mm_packs_epi32(r4, r5);

        counterB = _mm_add_epi32(counterB, r4); // accumulate

        // rotate right 4
        r4 = _mm_slli_epi16(r0, 12);
        r5 = _mm_slli_epi16(r1, 12);
        r6 = _mm_slli_epi16(r2, 12);
        r7 = _mm_slli_epi16(r3, 12);
        r0 = _mm_srli_epi16(r0, 4);
        r1 = _mm_srli_epi16(r1, 4);
        r2 = _mm_srli_epi16(r2, 4);
        r3 = _mm_srli_epi16(r3, 4);
        r0 = _mm_or_si128(r0, r4);
        r1 = _mm_or_si128(r1, r5);
        r2 = _mm_or_si128(r2, r6);
        r3 = _mm_or_si128(r3, r7);

        // do it again...
        r4 = _mm_and_si128(mask_bits_a, r0);
        r5 = _mm_and_si128(mask_bits_a, r1);
        r6 = _mm_and_si128(mask_bits_a, r2);
        r7 = _mm_and_si128(mask_bits_a, r3);

        r4 = _mm_sad_epu8(r4, zero);
        r5 = _mm_sad_epu8(r5, zero);
        r6 = _mm_sad_epu8(r6, zero);
        r7 = _mm_sad_epu8(r7, zero);

        r4 = _mm_add_epi16(r4,r5);
        r4 = _mm_add_epi16(r4,r6);
        r4 = _mm_add_epi16(r4,r7);

        r5 = _mm_and_si128(mask_lo_cnt, r4);
        r4 = _mm_srli_epi16(r4, 6);
        r4 = _mm_packs_epi32(r4, r5);

        counterC = _mm_add_epi32(counterC, r4); // accumulate

        // do it again...
        r0 = _mm_and_si128(r0, mask_bits_b);
        r1 = _mm_and_si128(r1, mask_bits_b);
        r2 = _mm_and_si128(r2, mask_bits_b);
        r3 = _mm_and_si128(r3, mask_bits_b);

        r0 = _mm_sad_epu8(r0, zero);
        r1 = _mm_sad_epu8(r1, zero);
        r2 = _mm_sad_epu8(r2, zero);
        r3 = _mm_sad_epu8(r3, zero);

        r0 = _mm_add_epi16(r0,r1);
        r0 = _mm_add_epi16(r0,r2);
        r0 = _mm_add_epi16(r0,r3);

        r1 = _mm_avg_epu8(zero, r0);
        r1 = _mm_and_si128(r1, mask_lo_cnt);
        r0 = _mm_srli_epi16(r0, 7);
        r0 = _mm_packs_epi32(r0, r1);

        counterD = _mm_add_epi32(counterD, r0); // accumulate
    }

    // transpose then store counters
    __m128i counter_1098 = _mm_unpackhi_epi32(counterA, counterB);
    __m128i counter_76FE = _mm_unpacklo_epi32(counterA, counterB);
    __m128i counter_32BA = _mm_unpacklo_epi32(counterC, counterD);
    __m128i counter_54DC = _mm_unpackhi_epi32(counterC, counterD);
    __m128i counter_7654 = _mm_unpackhi_epi64(counter_54DC, counter_76FE);
    __m128i counter_FEDC = _mm_unpacklo_epi64(counter_54DC, counter_76FE);
    __m128i counter_3210 = _mm_unpackhi_epi64(counter_1098, counter_32BA);
    __m128i counter_BA98 = _mm_unpacklo_epi64(counter_1098, counter_32BA);

    
    _mm_storeu_si128((__m128i*)&buffer[0], counter_3210);
    _mm_storeu_si128((__m128i*)&buffer[4], counter_7654);
    _mm_storeu_si128((__m128i*)&buffer[8], counter_BA98);
    _mm_storeu_si128((__m128i*)&buffer[12], counter_FEDC);
    for (int i = 0; i < 16; ++i) flag_counts[i] += buffer[i];

    // scalar tail loop
    int tail = len & 31;
    if (tail != 0) {
        uint64_t countsA = 0;
        uint64_t countsB = 0;
        do {
            // zero-extend a bit to 8-bits then accumulate
            // (emulate pdep)
            const uint64_t mask_01 = UINT64_C(0x0101010101010101);// 100000001000000010000000100000001000000010000000100000001
            const uint64_t magic   = UINT64_C(0x0000040010004001);// 000000000000001000000000000010000000000000100000000000001
                                                                  // 1+(1<<14)+(1<<28)+(1<<42)
            uint64_t x = *data++;
            countsA += ((x & 0x5555) * magic) & mask_01; // 0101010101010101
            countsB += (((x >> 1) & 0x5555) * magic) & mask_01;
        } while (--tail);

        // transpose then store counters
        flag_counts[0]  += countsA & 0xFF;
        flag_counts[8]  += (countsA >>  8) & 0xFF;
        flag_counts[2]  += (countsA >> 16) & 0xFF;
        flag_counts[10] += (countsA >> 24) & 0xFF;
        flag_counts[4]  += (countsA >> 32) & 0xFF;
        flag_counts[12] += (countsA >> 40) & 0xFF;
        flag_counts[6]  += (countsA >> 48) & 0xFF;
        flag_counts[14] += (countsA >> 56) & 0xFF;
        flag_counts[1]  += countsB & 0xFF;
        flag_counts[9]  += (countsB >>  8) & 0xFF;
        flag_counts[3]  += (countsB >> 16) & 0xFF;
        flag_counts[11] += (countsB >> 24) & 0xFF;
        flag_counts[5]  += (countsB >> 32) & 0xFF;
        flag_counts[13] += (countsB >> 40) & 0xFF;
        flag_counts[7]  += (countsB >> 48) & 0xFF;
        flag_counts[15] += (countsB >> 56) & 0xFF;
    }

    return 0;
}